

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void __thiscall gnilk::LogManager::Close(LogManager *this)

{
  __shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (this->isInitialized == true) {
    std::mutex::lock(&this->instLock);
    this->bQuitSinkThread = true;
    std::thread::join();
    SendToSinks(this);
    (*((this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_LogIPCBase[3])();
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>
               ,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    LogCache::Clear((this->cache).super___shared_ptr<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
    std::
    vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
    ::clear(&this->sinks);
    this->isInitialized = false;
    pthread_mutex_unlock((pthread_mutex_t *)&this->instLock);
  }
  return;
}

Assistant:

void LogManager::Close() {
    // This can happen if someone calls close explicitly
    if (!isInitialized) {
        return;
    }
    // event pipe will close through DTOR
    std::lock_guard<std::mutex> lock(instLock);
    // Quit the sink-thread
    bQuitSinkThread = true;
    sinkThread.join();

    // Send any left-overs from the queue
    SendToSinks();

    // Close and clear internal stuff
    ipcHandler->Close();
    ipcHandler = nullptr;   // Must set this reference to null

    cache->Clear();
    sinks.clear();
    // logInstances.clear();    - DO NOT CLEAR THIS!!!!
    isInitialized = false;
}